

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

void Cbs_ManStop(Cbs_Man_t *p)

{
  Cbs_Man_t *p_local;
  
  Vec_IntFree(p->vLevReas);
  Vec_IntFree(p->vModel);
  Vec_PtrFree(p->vTemp);
  if ((p->pClauses).pData != (Gia_Obj_t **)0x0) {
    free((p->pClauses).pData);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  if ((p->pProp).pData != (Gia_Obj_t **)0x0) {
    free((p->pProp).pData);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  if ((p->pJust).pData != (Gia_Obj_t **)0x0) {
    free((p->pJust).pData);
    (p->pJust).pData = (Gia_Obj_t **)0x0;
  }
  if (p != (Cbs_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cbs_ManStop( Cbs_Man_t * p )
{
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}